

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O3

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadraticLine>::SetRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZQuadraticLine> *this,TPZAutoPointer<TPZRefPattern> *refpat)

{
  TPZReference *pTVar1;
  TPZRefPattern *pTVar2;
  int iVar3;
  uint uVar4;
  
  pTVar1 = (this->fRefPattern).fRef;
  if (((pTVar1 != (TPZReference *)0x0) &&
      (pTVar2 = pTVar1->fPointer, pTVar2 != (TPZRefPattern *)0x0)) &&
     (iVar3 = TPZRefPattern::operator==(pTVar2,refpat->fRef->fPointer), iVar3 != 0)) {
    return;
  }
  iVar3 = (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticLine>).
                                 super_TPZGeoEl + 0x1d0))(this);
  if (iVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Trying to set an refPattern to geoEl that is already refined!\nThis try was skipped!\n\n"
               ,0x55);
    return;
  }
  TPZAutoPointer<TPZRefPattern>::operator=(&this->fRefPattern,refpat);
  if ((refpat->fRef != (TPZReference *)0x0) &&
     (pTVar2 = refpat->fRef->fPointer, pTVar2 != (TPZRefPattern *)0x0)) {
    uVar4 = TPZRefPattern::NSubElements(pTVar2);
    TPZVec<long>::Resize(&this->fSubEl,(long)(int)uVar4);
    if ((int)uVar4 < 1) {
      return;
    }
    memset((this->fSubEl).fStore,0xff,(ulong)uVar4 << 3);
    return;
  }
  TPZVec<long>::Resize(&this->fSubEl,0);
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::SetRefPattern (TPZAutoPointer<TPZRefPattern> refpat){
	
#ifdef HUGE_DEBUG
	if (!refpat) {
		PZError << "Error trying to set a null refinement pattern objetct" << std::endl;
		return;
	}
#endif
	
	if(fRefPattern && (*fRefPattern == *refpat)){//they are the same refinement pattern
		return;
	}
	else if(this->HasSubElement())
	{
#ifdef PZ_LOG
        TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
		LOGPZ_ERROR ( loggerrefpattern, "\nTrying to set an refPattern to geoEl that is already refined!\nThis try was skipped!\n\n" );
#endif
		std::cout << "Trying to set an refPattern to geoEl that is already refined!\nThis try was skipped!\n\n";
		
		return;
	}
	fRefPattern = refpat;
    if(!refpat)
    {
        fSubEl.Resize(0);
    }
    else
    {
        int nsubel = refpat->NSubElements();
        fSubEl.Resize(nsubel);
        for(int i=0;i<nsubel;i++) fSubEl[i] = -1;
    }
}